

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_1bdfec::LogisimParser::parse_xml(LogisimParser *this)

{
  CircuitConstruction *pCVar1;
  unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
  *this_00;
  __node_base_ptr *pp_Var2;
  __node_base *p_Var3;
  _Base_ptr *__s;
  size_type *psVar4;
  undefined1 *puVar5;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  tunnel_wire_map_t *this_02;
  _Prime_rehash_policy *p_Var6;
  __node_base_ptr *pp_Var7;
  __node_base_ptr *pp_Var8;
  size_type *psVar9;
  pointer pvVar10;
  pointer pvVar11;
  pointer puVar12;
  _Base_ptr p_Var13;
  pin_id_t *ppVar14;
  _Hash_node_base *p_Var15;
  xml_node xVar16;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var17;
  xml_node xVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  __type_conflict _Var22;
  int iVar23;
  uint32_t uVar24;
  xml_node *pxVar25;
  char_t *name;
  ModelCircuit *pMVar26;
  char_t *pcVar27;
  ModelComponent *this_03;
  pin_id_t pVar28;
  mapped_type *pmVar29;
  iterator iVar30;
  size_t sVar31;
  __node_ptr p_Var32;
  mapped_type *pmVar33;
  wire_node_t *this_04;
  wire_node_t *pwVar34;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  __position;
  ModelWire *this_05;
  iterator iVar35;
  _Hash_node_base *p_Var36;
  _Hash_node_base *p_Var37;
  __node_base_ptr *__s_00;
  __node_base_ptr *pp_Var38;
  _Base_ptr p_Var39;
  size_type *psVar40;
  __node_base_ptr *__s_01;
  __node_base_ptr *pp_Var41;
  ComponentProperties *props;
  _Hash_node_base _Var42;
  _Hash_node_base _Var43;
  __buckets_ptr pp_Var44;
  __buckets_ptr pp_Var45;
  Position *pos;
  undefined8 uVar46;
  Position *pos_00;
  Position *pos_01;
  ulong uVar47;
  ulong uVar48;
  __node_ptr __bkt;
  size_type sVar49;
  long *plVar50;
  wire_node_t *this_06;
  long lVar51;
  pin_id_t *ppVar52;
  char *pcVar53;
  xml_named_node_iterator *__x;
  _Hash_node_base _Var54;
  Value pull_to;
  __node_base_ptr p_Var55;
  __node_base_ptr p_Var56;
  wire_node_t *__range2;
  CircuitConstruction *this_07;
  unsigned_long *w;
  pointer puVar57;
  _Rb_tree_node_base *p_Var58;
  __node_base *p_Var59;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  undefined1 auVar60 [16];
  xml_node main_node;
  xml_node xStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  uint local_2f8;
  undefined2 local_2f4;
  undefined8 local_2f0;
  int local_2e8;
  undefined2 local_2e4;
  xml_attribute attr_val;
  allocator local_2d1;
  wire_container_t *__range1;
  _Rb_tree_node_base *local_2c8;
  xml_node_struct *local_2c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2b8;
  __node_base *local_2b0;
  xml_attribute attr_name;
  wire_node_t new_node;
  xml_node local_270;
  __node_base _Stack_268;
  Position local_260;
  string prop_val;
  xml_node circuit_node;
  xml_node comp;
  xml_attribute attr_loc;
  string comp_type;
  xml_named_node_iterator __begin1_1;
  xml_node project_node;
  xml_node name_node;
  xml_attribute attr_name_1;
  xml_node prop;
  xml_named_node_iterator __begin1_2;
  xml_named_node_iterator __end1_1;
  string prop_name;
  xml_named_node_iterator __end1_2;
  string wire_to;
  string comp_loc;
  xml_named_node_iterator __end1;
  xml_named_node_iterator __begin1;
  xml_object_range<pugi::xml_named_node_iterator> local_60;
  
  project_node = pugi::xml_node::child(&this->m_xml_doc->super_xml_node,"project");
  bVar19 = pugi::xml_node::operator!(&project_node);
  if (bVar19) {
    bVar19 = false;
  }
  else {
    pugi::xml_node::children(&local_60,&project_node,"circuit");
    __begin1._name = local_60._begin._name;
    __begin1._wrap._root = local_60._begin._wrap._root;
    __begin1._parent._root = local_60._begin._parent._root;
    __end1._name = local_60._end._name;
    __end1._wrap._root = local_60._end._wrap._root;
    __end1._parent._root = local_60._end._parent._root;
    pCVar1 = &this->m_context;
    this_01 = (this->m_context).m_circuit_ipins;
    this_00 = &(this->m_context).m_pin_locs;
    local_2c0 = (xml_node_struct *)&(this->m_context).m_ipin_offsets;
    __range1 = &(this->m_context).m_wires;
    this_02 = &(this->m_context).m_tunnels;
    local_2b8 = &(this->m_circuits)._M_h;
    p_Var6 = &(this->m_context).m_ipin_offsets._M_h._M_rehash_policy;
    pp_Var7 = &(this->m_context).m_ipin_offsets._M_h._M_single_bucket;
    local_2b0 = &(this->m_context).m_ipin_offsets._M_h._M_before_begin;
    pp_Var2 = &(this->m_circuits)._M_h._M_single_bucket;
    p_Var3 = &(this->m_circuits)._M_h._M_before_begin;
    pp_Var8 = &(this->m_context).m_pin_locs._M_h._M_single_bucket;
    while( true ) {
      bVar19 = pugi::xml_named_node_iterator::operator!=(&__begin1,&__end1);
      if (!bVar19) break;
      pxVar25 = pugi::xml_named_node_iterator::operator*(&__begin1);
      circuit_node._root = pxVar25->_root;
      name_node = pugi::xml_node::find_child_by_attribute(&circuit_node,"a","name","circuit");
      bVar19 = pugi::xml_node::operator!(&name_node);
      if (!bVar19) {
        main_node._root = (xml_node_struct *)pugi::xml_node::attribute(&name_node,"val");
        name = pugi::xml_attribute::value((xml_attribute *)&main_node);
        pMVar26 = lsim::LSimContext::create_user_circuit(this->m_lsim_context,name);
        (this->m_context).m_circuit = pMVar26;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&this_01->_M_t);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&(this->m_context).m_circuit_ipins[1]._M_t);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&this_00->_M_h);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_2c0);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::clear(__range1);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&this_02->_M_h);
        pugi::xml_node::children
                  ((xml_object_range<pugi::xml_named_node_iterator> *)&wire_to,&circuit_node,"comp")
        ;
        __begin1_1._name = (char_t *)wire_to.field_2._M_allocated_capacity;
        __begin1_1._wrap._root = (xml_node_struct *)wire_to._M_dataplus._M_p;
        __begin1_1._parent._root = (xml_node_struct *)wire_to._M_string_length;
        __end1_1._wrap._root = (xml_node_struct *)wire_to.field_2._8_8_;
        while( true ) {
          bVar19 = pugi::xml_named_node_iterator::operator!=(&__begin1_1,&__end1_1);
          if (!bVar19) break;
          pxVar25 = pugi::xml_named_node_iterator::operator*(&__begin1_1);
          comp._root = pxVar25->_root;
          attr_name = pugi::xml_node::attribute(&comp,"name");
          bVar19 = pugi::xml_attribute::operator!(&attr_name);
          if (!bVar19) {
            pcVar27 = pugi::xml_attribute::value(&attr_name);
            std::__cxx11::string::string((string *)&comp_type,pcVar27,(allocator *)&main_node);
            attr_loc = pugi::xml_node::attribute(&comp,"loc");
            bVar19 = pugi::xml_attribute::operator!(&attr_loc);
            if (!bVar19) {
              pcVar27 = pugi::xml_attribute::value(&attr_loc);
              std::__cxx11::string::string((string *)&comp_loc,pcVar27,(allocator *)&main_node);
              main_node._root = (xml_node_struct *)0x0;
              local_328._M_allocated_capacity = 0;
              aStack_318._M_allocated_capacity = (size_type)&local_308;
              aStack_318._8_8_ = 0;
              local_308._M_local_buf[0] = '\0';
              local_2f4._0_1_ = false;
              local_2f4._1_1_ = false;
              local_328._8_4_ = 1;
              xStack_330._root._0_4_ = 2;
              local_2f0._0_4_ = 2;
              local_2f0._4_4_ = 2;
              local_2e8 = -1;
              local_2e4._0_1_ = false;
              local_2e4._1_1_ = false;
              local_2f8 = local_328._8_4_;
              bVar19 = parse_location((LogisimParser *)&comp_loc,(string *)&local_328,pos);
              if (!bVar19) goto LAB_0015c2ae;
              pugi::xml_node::children
                        ((xml_object_range<pugi::xml_named_node_iterator> *)&new_node,&comp,"a");
              __begin1_2._name =
                   (char_t *)
                   new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              __begin1_2._wrap._root =
                   (xml_node_struct *)
                   new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              __begin1_2._parent._root =
                   (xml_node_struct *)
                   new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              props = (ComponentProperties *)&local_270;
              __end1_2._name = (char_t *)local_260;
              __end1_2._wrap._root = local_270._root;
              __end1_2._parent._root = (xml_node_struct *)_Stack_268._M_nxt;
              bVar19 = false;
              local_2c8 = (_Rb_tree_node_base *)CONCAT44(local_2c8._4_4_,1);
              pull_to = VALUE_FALSE;
              while( true ) {
                bVar20 = pugi::xml_named_node_iterator::operator!=(&__begin1_2,&__end1_2);
                if (!bVar20) break;
                pxVar25 = pugi::xml_named_node_iterator::operator*(&__begin1_2);
                prop._root = pxVar25->_root;
                attr_name_1 = pugi::xml_node::attribute(&prop,"name");
                bVar20 = pugi::xml_attribute::operator!(&attr_name_1);
                if (bVar20) goto LAB_0015c2ae;
                pcVar27 = pugi::xml_attribute::value(&attr_name_1);
                std::__cxx11::string::string((string *)&prop_name,pcVar27,(allocator *)&prop_val);
                attr_val = pugi::xml_node::attribute(&prop,"val");
                bVar20 = pugi::xml_attribute::operator!(&attr_val);
                if (!bVar20) {
                  pcVar27 = pugi::xml_attribute::value(&attr_val);
                  std::__cxx11::string::string((string *)&prop_val,pcVar27,&local_2d1);
                  bVar21 = std::operator==(&prop_name,"label");
                  if (bVar21) {
                    std::__cxx11::string::_M_assign((string *)aStack_318._M_local_buf);
                  }
                  else {
                    bVar21 = std::operator==(&prop_name,"size");
                    if (bVar21) {
                      iVar23 = pugi::xml_attribute::as_int(&attr_val,(int)main_node._root);
                      main_node._root._0_4_ = iVar23;
                    }
                    else {
                      bVar21 = std::operator==(&prop_name,"facing");
                      if (bVar21) {
                        bVar21 = std::operator==(&prop_val,"north");
                        if (bVar21) {
                          local_328._8_4_ = 0;
                        }
                        else {
                          bVar21 = std::operator==(&prop_val,"east");
                          if (bVar21) {
                            local_328._8_4_ = 1;
                          }
                          else {
                            bVar21 = std::operator==(&prop_val,"south");
                            if (bVar21) {
                              local_328._8_4_ = 2;
                            }
                            else {
                              bVar21 = std::operator==(&prop_val,"west");
                              pcVar53 = "Invalid facing \"%s\"";
                              if (bVar21) {
                                local_328._8_4_ = 3;
                              }
                              else {
LAB_0015c007:
                                error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                          ,pcVar53,prop_val._M_dataplus._M_p);
                              }
                            }
                          }
                        }
                      }
                      else {
                        bVar21 = std::operator==(&prop_name,"inputs");
                        if (bVar21) {
                          xStack_330._root._0_4_ =
                               pugi::xml_attribute::as_int(&attr_val,(uint32_t)xStack_330._root);
                        }
                        else {
                          bVar21 = std::operator==(&prop_name,"control");
                          if (bVar21) {
                            bVar19 = std::operator==(&prop_val,"left");
                          }
                          else {
                            bVar21 = std::operator==(&prop_name,"value");
                            if (bVar21) {
                              bVar21 = std::operator==(&prop_val,"0x0");
                              local_2c8 = (_Rb_tree_node_base *)
                                          CONCAT44(local_2c8._4_4_,(uint)!bVar21);
                            }
                            else {
                              bVar21 = std::operator==(&prop_name,"output");
                              if (bVar21) {
                                bVar21 = std::operator==(&prop_val,"true");
                                local_2e4._0_1_ = bVar21;
                              }
                              else {
                                bVar21 = std::operator==(&prop_name,"tristate");
                                if (bVar21) {
                                  bVar21 = std::operator==(&prop_val,"true");
                                  local_2e4._1_1_ = bVar21;
                                }
                                else {
                                  bVar21 = std::operator==(&prop_name,"width");
                                  if (bVar21) {
                                    local_2f8 = pugi::xml_attribute::as_int(&attr_val,local_2f8);
                                  }
                                  else {
                                    bVar21 = std::operator==(&prop_name,"fanout");
                                    if (bVar21) {
                                      uVar24 = pugi::xml_attribute::as_int(&attr_val,0);
                                      local_2f0._0_4_ = uVar24;
                                    }
                                    else {
                                      bVar21 = std::operator==(&prop_name,"incoming");
                                      if (bVar21) {
                                        uVar24 = pugi::xml_attribute::as_int(&attr_val,0);
                                        local_2f0._4_4_ = uVar24;
                                      }
                                      else {
                                        bVar21 = std::operator==(&prop_name,"appear");
                                        if (bVar21) {
                                          bVar21 = std::operator==(&prop_val,"center");
                                          if ((bVar21) ||
                                             (bVar21 = std::operator==(&prop_val,"legacy"), bVar21))
                                          {
                                            local_2e8 = 0;
                                          }
                                          else {
                                            bVar21 = std::operator==(&prop_val,"right");
                                            if (bVar21) {
                                              local_2e8 = 1;
                                            }
                                            else {
                                              bVar21 = std::operator==(&prop_val,"left");
                                              pcVar53 = "Invalid splitter appearance \"%s\"";
                                              if (!bVar21) goto LAB_0015c007;
                                              local_2e8 = -1;
                                            }
                                          }
                                        }
                                        else {
                                          bVar21 = std::operator==(&prop_name,"pull");
                                          if (bVar21) {
                                            bVar21 = std::operator==(&prop_val,"1");
                                            if (bVar21) {
                                              pull_to = VALUE_TRUE;
                                            }
                                            else {
                                              bVar21 = std::operator==(&prop_val,"X");
                                              pull_to = (uint)bVar21 + (uint)bVar21 * 2;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  std::__cxx11::string::~string((string *)&prop_val);
                }
                std::__cxx11::string::~string((string *)&prop_name);
                if (bVar20) goto LAB_0015c2ae;
                pugi::xml_named_node_iterator::operator++(&__begin1_2);
              }
              bVar20 = std::operator==(&comp_type,"Buffer");
              if (bVar20) {
                this_03 = lsim::ModelCircuit::add_buffer(pCVar1->m_circuit,local_2f8);
                bVar20 = true;
                handle_buffer(this,this_03,(ComponentProperties *)&main_node,false,false);
LAB_0015c255:
                if ((bVar20 != false) && (this_03 != (ModelComponent *)0x0)) {
                  lsim::Point::Point((Point *)&new_node,
                                     (float)(int)local_328._M_allocated_capacity._4_4_ +
                                     (float)(int)local_328._M_allocated_capacity._4_4_,
                                     (float)(int)local_328._M_allocated_capacity._0_4_ +
                                     (float)(int)local_328._M_allocated_capacity._0_4_);
                  lsim::ModelComponent::set_position(this_03,(Point *)&new_node);
                  iVar23 = 0xb4;
                  if ((ulong)(uint)local_328._8_4_ < 3) {
                    iVar23 = *(int *)(&DAT_00191660 + (ulong)(uint)local_328._8_4_ * 4);
                  }
                  lsim::ModelComponent::set_angle(this_03,iVar23);
                }
              }
              else {
                bVar20 = std::operator==(&comp_type,"Controlled Buffer");
                if (bVar20) {
                  this_03 = lsim::ModelCircuit::add_tristate_buffer(pCVar1->m_circuit,local_2f8);
                  bVar20 = true;
                  handle_buffer(this,this_03,(ComponentProperties *)&main_node,true,bVar19);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"Constant");
                if (bVar19) {
                  this_03 = lsim::ModelCircuit::add_constant(pCVar1->m_circuit,(Value)local_2c8);
                  pVar28 = lsim::ModelComponent::pin_id(this_03,0);
                  bVar20 = true;
                  add_pin_location(this,(Position *)&local_328,pVar28);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"Pin");
                if (bVar19) {
                  if (local_2e4._0_1_ == false) {
                    this_03 = lsim::ModelCircuit::add_connector_in
                                        (pCVar1->m_circuit,(char *)aStack_318._M_allocated_capacity,
                                         local_2f8,false);
                  }
                  else {
                    this_03 = lsim::ModelCircuit::add_connector_out
                                        (pCVar1->m_circuit,(char *)aStack_318._M_allocated_capacity,
                                         local_2f8,false);
                  }
                  pVar28 = lsim::ModelComponent::pin_id(this_03,0);
                  add_pin_location(this,(Position *)&local_328,pVar28,
                                   (ulong)(this_03->m_outputs + this_03->m_inputs));
                  pmVar29 = std::
                            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](this_01 + local_2e4._0_1_,&local_328._M_allocated_capacity)
                  ;
                  std::__cxx11::string::_M_assign((string *)pmVar29);
                  bVar20 = true;
                  if ((local_2e4._0_1_ == true) && ((uint)local_328._8_4_ < 4)) {
                    local_328._8_4_ = 1;
                  }
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"AND Gate");
                if (bVar19) {
                  this_03 = lsim::ModelCircuit::add_and_gate
                                      (pCVar1->m_circuit,(uint32_t)xStack_330._root);
                  bVar20 = handle_gate(this,this_03,(ComponentProperties *)&main_node);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"OR Gate");
                if (bVar19) {
                  this_03 = lsim::ModelCircuit::add_or_gate
                                      (pCVar1->m_circuit,(uint32_t)xStack_330._root);
                  bVar20 = handle_gate(this,this_03,(ComponentProperties *)&main_node);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"NOT Gate");
                if (bVar19) {
                  this_03 = lsim::ModelCircuit::add_not_gate(pCVar1->m_circuit);
                  xStack_330._root._0_4_ = 1;
                  pcVar53 = "%d-bit gates are not supported";
                  if (local_2f8 != 1) goto LAB_0015c4bb;
                  if ((int)main_node._root == 0) {
                    main_node._root._0_4_ = 0x1e;
                  }
                  new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start =
                       (pointer)input_pin_location((LogisimParser *)local_328._M_allocated_capacity,
                                                   (Position)0x0,(uint32_t)&main_node,props);
                  pVar28 = lsim::ModelComponent::input_pin_id(this_03,0);
                  add_pin_location(this,(Position *)&new_node,pVar28);
                  pVar28 = lsim::ModelComponent::output_pin_id(this_03,0);
                  bVar20 = true;
                  add_pin_location(this,(Position *)&local_328,pVar28);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"NAND Gate");
                if (bVar19) {
                  this_03 = lsim::ModelCircuit::add_nand_gate
                                      (pCVar1->m_circuit,(uint32_t)xStack_330._root);
                  local_2f4._0_1_ = true;
                  bVar20 = handle_gate(this,this_03,(ComponentProperties *)&main_node);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"NOR Gate");
                if (bVar19) {
                  this_03 = lsim::ModelCircuit::add_nor_gate
                                      (pCVar1->m_circuit,(uint32_t)xStack_330._root);
                  local_2f4._0_1_ = true;
                  bVar20 = handle_gate(this,this_03,(ComponentProperties *)&main_node);
                  goto LAB_0015c255;
                }
                bVar19 = std::operator==(&comp_type,"XOR Gate");
                if (bVar19) {
                  pcVar53 = "XOR-gates with %d inputs are not supported";
                  if ((uint32_t)xStack_330._root == 2) {
                    this_03 = lsim::ModelCircuit::add_xor_gate(pCVar1->m_circuit);
                    main_node._root._4_4_ = 10;
                    bVar20 = handle_gate(this,this_03,(ComponentProperties *)&main_node);
                    goto LAB_0015c255;
                  }
LAB_0015c4bb:
                  error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                            ,pcVar53);
                }
                else {
                  bVar19 = std::operator==(&comp_type,"XNOR Gate");
                  if (bVar19) {
                    pcVar53 = "XOR-gates with %d inputs are not supported";
                    if ((uint32_t)xStack_330._root != 2) goto LAB_0015c4bb;
                    this_03 = lsim::ModelCircuit::add_xnor_gate(pCVar1->m_circuit);
                    main_node._root._4_4_ = 10;
                    local_2f4._0_1_ = true;
                    bVar20 = handle_gate(this,this_03,(ComponentProperties *)&main_node);
                    goto LAB_0015c255;
                  }
                  bVar19 = std::operator==(&comp_type,"Splitter");
                  if (!bVar19) {
                    bVar19 = std::operator==(&comp_type,"Tunnel");
                    if (bVar19) {
                      if (aStack_318._8_8_ == 0) {
                        pcVar53 = "Cannot process tunnel with an empty label (%s)";
                        uVar46 = aStack_318._M_allocated_capacity;
LAB_0015c672:
                        error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                  ,pcVar53,uVar46);
                      }
                      else {
                        iVar30 = std::
                                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 ::find(&this_02->_M_h,(key_type *)&aStack_318);
                        if (iVar30.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            ._M_cur == (__node_type *)0x0) {
                          prop_name._M_dataplus._M_p = (pointer)local_328._M_allocated_capacity;
                          __l._M_len = 1;
                          __l._M_array = (iterator)&prop_name;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    (&new_node,__l,(allocator_type *)&prop_val);
                          std::
                          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ::push_back(__range1,&new_node);
                          pvVar10 = (this->m_context).m_wires.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pvVar11 = (this->m_context).m_wires.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          pmVar33 = std::__detail::
                                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)this_02,(key_type *)&aStack_318);
                          *pmVar33 = ((long)pvVar11 - (long)pvVar10) / 0x18 - 1;
                          Catch::clara::std::
                          _Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &new_node);
                        }
                        else {
                          Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                          push_back((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    ((__range1->
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start +
                                    *(long *)((long)iVar30.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28)),&local_328._M_allocated_capacity)
                          ;
                        }
                      }
                    }
                    else {
                      bVar19 = std::operator==(&comp_type,"Pull Resistor");
                      if (bVar19) {
                        this_03 = lsim::ModelCircuit::add_pull_resistor(pCVar1->m_circuit,pull_to);
                        pVar28 = lsim::ModelComponent::pin_id(this_03,0);
                        bVar20 = true;
                        add_pin_location(this,(Position *)&local_328,pVar28);
                        goto LAB_0015c255;
                      }
                      bVar19 = std::operator==(&comp_type,"Text");
                      if ((!bVar19) &&
                         (bVar19 = std::operator==(&comp_type,"Probe"), p_Var17 = local_2b8, !bVar19
                         )) {
                        sVar31 = std::
                                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_2b8,&comp_type);
                        p_Var32 = std::
                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  ::_M_find_node(p_Var17,sVar31 % (this->m_circuits)._M_h.
                                                                  _M_bucket_count,
                                                 (key_type *)&comp_type,sVar31);
                        if (p_Var32 != (__node_ptr)0x0) {
                          this_03 = lsim::ModelCircuit::add_sub_circuit
                                              (pCVar1->m_circuit,comp_type._M_dataplus._M_p);
                          plVar50 = (long *)((long)&(p_Var32->
                                                                                                        
                                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                                  ._M_storage._M_storage + 0xd0);
                          while (plVar50 = (long *)*plVar50, plVar50 != (long *)0x0) {
                            new_node.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT44((int)((ulong)plVar50[5] >> 0x20) +
                                                   (int)((ulong)local_328._0_8_ >> 0x20),
                                                   (int)plVar50[5] +
                                                   (int)local_328._M_allocated_capacity);
                            pVar28 = lsim::ModelComponent::port_by_name(this_03,(char *)plVar50[1]);
                            add_pin_location(this,(Position *)&new_node,pVar28);
                          }
                          bVar20 = true;
                          if (this_03 != (ModelComponent *)0x0) goto LAB_0015c255;
                        }
                        pcVar53 = "Unsupport component (%s) - loading failed";
                        uVar46 = comp_type._M_dataplus._M_p;
                        goto LAB_0015c672;
                      }
                    }
                  }
                }
              }
LAB_0015c2ae:
              std::__cxx11::string::~string((string *)aStack_318._M_local_buf);
              std::__cxx11::string::~string((string *)&comp_loc);
            }
            std::__cxx11::string::~string((string *)&comp_type);
          }
          pugi::xml_named_node_iterator::operator++(&__begin1_1);
        }
        pugi::xml_node::children
                  ((xml_object_range<pugi::xml_named_node_iterator> *)&main_node,&circuit_node,
                   "wire");
        comp_loc.field_2._M_allocated_capacity = local_328._M_allocated_capacity;
        comp_loc._M_dataplus._M_p = (pointer)main_node._root;
        comp_loc._M_string_length = (size_type)xStack_330._root;
        prop_name.field_2._M_allocated_capacity = aStack_318._8_8_;
        prop_name._M_dataplus._M_p = (pointer)CONCAT44(local_328._12_4_,local_328._8_4_);
        prop_name._M_string_length = aStack_318._M_allocated_capacity;
        while( true ) {
          bVar19 = pugi::xml_named_node_iterator::operator!=
                             ((xml_named_node_iterator *)&comp_loc,
                              (xml_named_node_iterator *)&prop_name);
          if (!bVar19) break;
          pxVar25 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&comp_loc);
          attr_name._attr = (xml_attribute_struct *)pxVar25->_root;
          __begin1_2._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&attr_name,"from");
          bVar19 = pugi::xml_attribute::operator!((xml_attribute *)&__begin1_2);
          if (!bVar19) {
            pcVar27 = pugi::xml_attribute::value((xml_attribute *)&__begin1_2);
            std::__cxx11::string::string((string *)&new_node,pcVar27,(allocator *)&wire_to);
            __end1_2._wrap._root =
                 (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&attr_name,"to");
            bVar19 = pugi::xml_attribute::operator!((xml_attribute *)&__end1_2);
            if (!bVar19) {
              pcVar27 = pugi::xml_attribute::value((xml_attribute *)&__end1_2);
              std::__cxx11::string::string((string *)&wire_to,pcVar27,(allocator *)&comp_type);
              __begin1_1._wrap._root = (xml_node_struct *)0x0;
              __end1_1._wrap._root = (xml_node_struct *)0x0;
              bVar19 = parse_location((LogisimParser *)&new_node,(string *)&__begin1_1,pos_00);
              if ((bVar19) &&
                 (bVar19 = parse_location((LogisimParser *)&wire_to,(string *)&__end1_1,pos_01),
                 xVar16 = __begin1_1._wrap, bVar19)) {
                this_04 = point_on_wire(this,(Position)__begin1_1._wrap._root);
                xVar18 = __end1_1._wrap;
                pwVar34 = point_on_wire(this,(Position)__end1_1._wrap._root);
                if (this_04 == (wire_node_t *)0x0 && pwVar34 == (wire_node_t *)0x0) {
                  prop_val._M_dataplus._M_p = (pointer)xVar16._root;
                  prop_val._M_string_length = (size_type)xVar18._root;
                  __l_00._M_len = 2;
                  __l_00._M_array = (iterator)&prop_val;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&comp_type,
                             __l_00,(allocator_type *)&attr_loc);
                  std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::push_back(__range1,(value_type *)&comp_type);
                  Catch::clara::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                  ~_Vector_base((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &comp_type);
                }
                else if (pwVar34 == (wire_node_t *)0x0 || this_04 == (wire_node_t *)0x0) {
                  __x = &__end1_1;
                  this_06 = this_04;
                  if ((this_04 != (wire_node_t *)0x0 && pwVar34 == (wire_node_t *)0x0) ||
                     (__x = &__begin1_1, this_06 = pwVar34,
                     this_04 == (wire_node_t *)0x0 && pwVar34 != (wire_node_t *)0x0)) {
                    Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    push_back((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_06,
                              (value_type_conflict2 *)__x);
                  }
                }
                else {
                  puVar12 = (pwVar34->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish;
                  for (puVar57 = (pwVar34->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start; puVar57 != puVar12;
                      puVar57 = puVar57 + 1) {
                    Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    push_back((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_04,
                              puVar57);
                  }
                  puVar57 = (pwVar34->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  if ((pwVar34->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish != puVar57) {
                    (pwVar34->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish = puVar57;
                  }
                  __position = std::
                               __find_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_long,std::allocator<unsigned_long>>const>>
                                         ((this->m_context).m_wires.
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (this->m_context).m_wires.
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,pwVar34);
                  std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::erase(__range1,(const_iterator)__position._M_current);
                }
              }
              std::__cxx11::string::~string((string *)&wire_to);
            }
            std::__cxx11::string::~string((string *)&new_node);
          }
          pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&comp_loc);
        }
        local_2c8 = (_Rb_tree_node_base *)
                    (this->m_context).m_wires.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        for (p_Var58 = (_Rb_tree_node_base *)
                       (this->m_context).m_wires.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; p_Var58 != local_2c8;
            p_Var58 = (_Rb_tree_node_base *)&p_Var58->_M_right) {
          this_05 = lsim::ModelCircuit::create_wire(pCVar1->m_circuit);
          p_Var13 = p_Var58->_M_parent;
          for (p_Var39 = *(_Base_ptr *)p_Var58; p_Var39 != p_Var13;
              p_Var39 = (_Base_ptr)&p_Var39->_M_parent) {
            iVar35 = std::
                     unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
                     ::find(this_00,(key_type *)p_Var39);
            if (iVar35.
                super__Node_iterator_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
                ._M_cur != (__node_type *)0x0) {
              ppVar14 = *(pin_id_t **)
                         ((long)iVar35.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
                                ._M_cur + 0x20);
              for (ppVar52 = *(pin_id_t **)
                              ((long)iVar35.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
                                     ._M_cur + 0x18); ppVar52 != ppVar14; ppVar52 = ppVar52 + 1) {
                lsim::ModelWire::add_pin(this_05,*ppVar52);
              }
            }
          }
          if ((this_05->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (this_05->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lsim::ModelCircuit::remove_wire(pCVar1->m_circuit,this_05->m_id);
          }
        }
        new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xffffff2400000000;
        new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (lVar51 = 0; xVar16._root = xStack_330._root, lVar51 != 2; lVar51 = lVar51 + 1) {
          p_Var39 = this_01[lVar51]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while ((_Rb_tree_header *)p_Var39 != &this_01[lVar51]._M_t._M_impl.super__Rb_tree_header)
          {
            __s = &p_Var39[1]._M_parent;
            local_2c8 = p_Var39;
            p_Var36 = (_Hash_node_base *)
                      std::
                      hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_2c0,(string *)__s);
            uVar47 = (ulong)p_Var36 % (this->m_context).m_ipin_offsets._M_h._M_bucket_count;
            p_Var56 = (this->m_context).m_ipin_offsets._M_h._M_buckets[uVar47];
            if (p_Var56 != (__node_base_ptr)0x0) {
              p_Var37 = p_Var56->_M_nxt[6]._M_nxt;
              p_Var15 = p_Var56->_M_nxt;
              while ((p_Var55 = p_Var15, p_Var37 != p_Var36 ||
                     (_Var22 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)__s,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(p_Var55 + 1)), !_Var22))) {
                p_Var15 = p_Var55->_M_nxt;
                if ((p_Var15 == (_Hash_node_base *)0x0) ||
                   (p_Var37 = p_Var15[6]._M_nxt, p_Var56 = p_Var55,
                   (ulong)p_Var37 % (this->m_context).m_ipin_offsets._M_h._M_bucket_count != uVar47)
                   ) goto LAB_0015cb90;
              }
              p_Var37 = p_Var56->_M_nxt;
              if (p_Var37 != (_Hash_node_base *)0x0) goto LAB_0015cd3a;
            }
LAB_0015cb90:
            main_node._root = local_2c0;
            p_Var37 = (_Hash_node_base *)operator_new(0x38);
            p_Var37->_M_nxt = (_Hash_node_base *)0x0;
            std::__cxx11::string::string((string *)(p_Var37 + 1),(string *)__s);
            p_Var37[5]._M_nxt = (_Hash_node_base *)0x0;
            auVar60 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)p_Var6,(this->m_context).m_ipin_offsets._M_h._M_bucket_count
                                 ,(this->m_context).m_ipin_offsets._M_h._M_element_count);
            sVar49 = auVar60._8_8_;
            if ((auVar60 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              __s_00 = (__node_base_ptr *)local_2c0->header;
            }
            else {
              if (sVar49 == 1) {
                *pp_Var7 = (__node_base_ptr)0x0;
                __s_00 = pp_Var7;
                p_Var59 = local_2b0;
              }
              else {
                __s_00 = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                         allocate((allocator_type *)&wire_to,sVar49);
                p_Var59 = local_2b0;
                memset(__s_00,0,sVar49 * 8);
              }
              _Var54._M_nxt = p_Var59->_M_nxt;
              p_Var59->_M_nxt = (_Hash_node_base *)0x0;
              uVar47 = 0;
LAB_0015cc3a:
              uVar48 = uVar47;
              _Var42._M_nxt = _Var54._M_nxt;
              if (_Var42._M_nxt != (_Hash_node_base *)0x0) {
                _Var54._M_nxt = (_Var42._M_nxt)->_M_nxt;
                uVar47 = (ulong)_Var42._M_nxt[6]._M_nxt % sVar49;
                if (__s_00[uVar47] == (_Hash_node_base *)0x0) goto LAB_0015cc6b;
                (_Var42._M_nxt)->_M_nxt = __s_00[uVar47]->_M_nxt;
                pp_Var38 = &__s_00[uVar47]->_M_nxt;
                uVar47 = uVar48;
                goto LAB_0015cc8a;
              }
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_deallocate_buckets
                        ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_2c0);
              (this->m_context).m_ipin_offsets._M_h._M_bucket_count = sVar49;
              (this->m_context).m_ipin_offsets._M_h._M_buckets = __s_00;
              uVar47 = (ulong)p_Var36 % sVar49;
            }
            p_Var37[6]._M_nxt = p_Var36;
            if (__s_00[uVar47] == (_Hash_node_base *)0x0) {
              p_Var36 = local_2b0->_M_nxt;
              p_Var37->_M_nxt = p_Var36;
              local_2b0->_M_nxt = p_Var37;
              if (p_Var36 != (_Hash_node_base *)0x0) {
                __s_00[(ulong)p_Var36[6]._M_nxt %
                       (this->m_context).m_ipin_offsets._M_h._M_bucket_count] = p_Var37;
                __s_00 = (this->m_context).m_ipin_offsets._M_h._M_buckets;
              }
              __s_00[uVar47] = local_2b0;
            }
            else {
              p_Var37->_M_nxt = __s_00[uVar47]->_M_nxt;
              __s_00[uVar47]->_M_nxt = p_Var37;
            }
            psVar9 = &(this->m_context).m_ipin_offsets._M_h._M_element_count;
            *psVar9 = *psVar9 + 1;
            xStack_330._root = (xml_node_struct *)0x0;
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Scoped_node::~_Scoped_node((_Scoped_node *)&main_node);
LAB_0015cd3a:
            p_Var36 = (_Hash_node_base *)
                      (&new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start)[lVar51];
            p_Var37[5]._M_nxt = p_Var36;
            *(int *)(&new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar51) = (int)p_Var36 + 0x14;
            p_Var39 = (_Base_ptr)std::_Rb_tree_increment(local_2c8);
          }
        }
        std::__cxx11::string::string((string *)&main_node,name,(allocator *)&comp_type);
        p_Var17 = local_2b8;
        sVar31 = std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_2b8,(string *)&main_node);
        __bkt = (__node_ptr)(sVar31 % (this->m_circuits)._M_h._M_bucket_count);
        _Var54._M_nxt = (_Hash_node_base *)__bkt;
        p_Var32 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_node(p_Var17,(size_type)__bkt,(key_type *)&main_node,sVar31);
        if (p_Var32 == (__node_ptr)0x0) {
          new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_2b8;
          p_Var32 = (__node_ptr)operator_new(0x158);
          (p_Var32->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
          psVar40 = (size_type *)
                    ((long)&(p_Var32->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                            ._M_storage._M_storage + 0x10);
          *(size_type **)
           &(p_Var32->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
            ._M_storage._M_storage = psVar40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)main_node._root == &local_328) {
            *psVar40 = local_328._M_allocated_capacity;
            *(ulong *)((long)&(p_Var32->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                              ._M_storage._M_storage + 0x18) =
                 CONCAT44(local_328._12_4_,local_328._8_4_);
          }
          else {
            (p_Var32->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
            ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)main_node._root;
            *(size_type *)
             ((long)&(p_Var32->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x10) = local_328._M_allocated_capacity;
          }
          xStack_330._root = (xml_node_struct *)0x0;
          *(xml_node_struct **)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 8) = xVar16._root;
          local_328._M_allocated_capacity = local_328._M_allocated_capacity & 0xffffffffffffff00;
          this_07 = (CircuitConstruction *)
                    ((long)&(p_Var32->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                            ._M_storage._M_storage + 0x20);
          main_node._root = (xml_node_struct *)&local_328;
          memset(this_07,0,0x128);
          CircuitConstruction::CircuitConstruction(this_07);
          _Var54._M_nxt = (_Hash_node_base *)(this->m_circuits)._M_h._M_bucket_count;
          new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)p_Var32;
          auVar60 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)&(this->m_circuits)._M_h._M_rehash_policy,(ulong)_Var54._M_nxt
                               ,(this->m_circuits)._M_h._M_element_count);
          sVar49 = auVar60._8_8_;
          if ((auVar60 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __s_01 = ((_Hashtable *)&local_2b8->_M_buckets)->_M_buckets;
          }
          else {
            if (sVar49 == 1) {
              *pp_Var2 = (__node_base_ptr)0x0;
              __s_01 = pp_Var2;
            }
            else {
              __s_01 = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                       allocate((allocator_type *)&wire_to,sVar49);
              _Var54._M_nxt = (_Hash_node_base *)0x0;
              memset(__s_01,0,sVar49 * 8);
            }
            _Var42._M_nxt = p_Var3->_M_nxt;
            p_Var3->_M_nxt = (_Hash_node_base *)0x0;
            uVar47 = 0;
LAB_0015ceed:
            uVar48 = uVar47;
            _Var43._M_nxt = _Var42._M_nxt;
            if (_Var43._M_nxt != (_Hash_node_base *)0x0) {
              _Var42._M_nxt = (_Var43._M_nxt)->_M_nxt;
              uVar47 = (ulong)_Var43._M_nxt[0x2a]._M_nxt % sVar49;
              _Var54._M_nxt = _Var43._M_nxt;
              if (__s_01[uVar47] == (_Hash_node_base *)0x0) goto LAB_0015cf1f;
              (_Var43._M_nxt)->_M_nxt = __s_01[uVar47]->_M_nxt;
              pp_Var41 = &__s_01[uVar47]->_M_nxt;
              uVar47 = uVar48;
              goto LAB_0015cf36;
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_deallocate_buckets(local_2b8);
            (this->m_circuits)._M_h._M_bucket_count = sVar49;
            (this->m_circuits)._M_h._M_buckets = __s_01;
            __bkt = (__node_ptr)(sVar31 % sVar49);
          }
          (p_Var32->
          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
          ).super__Hash_node_code_cache<true>._M_hash_code = sVar31;
          if (__s_01[(long)__bkt] == (_Hash_node_base *)0x0) {
            p_Var36 = p_Var3->_M_nxt;
            (p_Var32->super__Hash_node_base)._M_nxt = p_Var36;
            p_Var3->_M_nxt = (_Hash_node_base *)p_Var32;
            if (p_Var36 != (_Hash_node_base *)0x0) {
              __s_01[(ulong)p_Var36[0x2a]._M_nxt % (this->m_circuits)._M_h._M_bucket_count] =
                   (__node_base_ptr)p_Var32;
              __s_01 = (this->m_circuits)._M_h._M_buckets;
            }
            __s_01[(long)__bkt] = p_Var3;
          }
          else {
            (p_Var32->super__Hash_node_base)._M_nxt = __s_01[(long)__bkt]->_M_nxt;
            __s_01[(long)__bkt]->_M_nxt = (_Hash_node_base *)p_Var32;
          }
          psVar4 = &(this->m_circuits)._M_h._M_element_count;
          *psVar4 = *psVar4 + 1;
          new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_Scoped_node::~_Scoped_node((_Scoped_node *)&new_node);
        }
        puVar5 = (undefined1 *)
                 ((long)&(p_Var32->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                         ._M_storage._M_storage + 0x20);
        *(ModelCircuit **)
         ((long)&(p_Var32->
                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                 ._M_storage._M_storage + 0x20) = pCVar1->m_circuit;
        if (pCVar1 != (CircuitConstruction *)puVar5) {
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
          ::_M_deallocate_nodes
                    (*(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                       **)((long)&(p_Var32->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                  ._M_storage._M_storage + 0x38),(__node_ptr)_Var54._M_nxt);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_deallocate_buckets
                    ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)((long)&(p_Var32->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                ._M_storage._M_storage + 0x28));
          sVar31 = (this->m_context).m_pin_locs._M_h._M_rehash_policy._M_next_resize;
          *(undefined8 *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x48) =
               *(undefined8 *)&(this->m_context).m_pin_locs._M_h._M_rehash_policy;
          *(size_t *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x50) = sVar31;
          pp_Var44 = (this_00->_M_h)._M_buckets;
          if (pp_Var8 == pp_Var44) {
            pp_Var44 = (__buckets_ptr)
                       ((long)&(p_Var32->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + 0x58);
            *(__node_base_ptr *)
             ((long)&(p_Var32->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0x58) = *pp_Var8;
          }
          *(__buckets_ptr *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x28) = pp_Var44;
          _Var54._M_nxt = (_Hash_node_base *)(this->m_context).m_pin_locs._M_h._M_bucket_count;
          *(_Hash_node_base **)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x30) = _Var54._M_nxt;
          p_Var36 = (this->m_context).m_pin_locs._M_h._M_before_begin._M_nxt;
          *(_Hash_node_base **)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x38) = p_Var36;
          *(size_type *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0x40) =
               (this->m_context).m_pin_locs._M_h._M_element_count;
          if (p_Var36 != (_Hash_node_base *)0x0) {
            pp_Var44[(ulong)p_Var36[1]._M_nxt % (ulong)_Var54._M_nxt] =
                 (__node_base_ptr)
                 ((long)&(p_Var32->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                         ._M_storage._M_storage + 0x38);
          }
          *(undefined1 (*) [16])&(this->m_context).m_pin_locs._M_h._M_rehash_policy._M_next_resize =
               (undefined1  [16])0x0;
          (this->m_context).m_pin_locs._M_h._M_bucket_count = 1;
          (this->m_context).m_pin_locs._M_h._M_buckets = pp_Var8;
          (this->m_context).m_pin_locs._M_h._M_before_begin = (_Hash_node_base *)0x0;
          (this->m_context).m_pin_locs._M_h._M_element_count = 0;
        }
        for (lVar51 = 0; lVar51 != 0x60; lVar51 = lVar51 + 0x30) {
          _Var54._M_nxt = (_Hash_node_base *)(&(this_01->_M_t)._M_impl.field_0x0 + lVar51);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)&(p_Var32->
                                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                 ._M_storage._M_storage + lVar51 + 0x60),
                      (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)_Var54._M_nxt);
        }
        if (pCVar1 != (CircuitConstruction *)puVar5) {
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
          ::_M_deallocate_nodes
                    (*(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                       **)((long)&(p_Var32->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                  ._M_storage._M_storage + 0xd0),(__node_ptr)_Var54._M_nxt);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_deallocate_buckets
                    ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)((long)&(p_Var32->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                ._M_storage._M_storage + 0xc0));
          sVar31 = (this->m_context).m_ipin_offsets._M_h._M_rehash_policy._M_next_resize;
          *(undefined8 *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0xe0) = *(undefined8 *)p_Var6;
          *(size_t *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0xe8) = sVar31;
          pp_Var45 = ((_Hashtable *)&local_2c0->header)->_M_buckets;
          if (pp_Var7 == pp_Var45) {
            pp_Var45 = (__buckets_ptr)
                       ((long)&(p_Var32->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + 0xf0);
            *(__node_base_ptr *)
             ((long)&(p_Var32->
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                     ._M_storage._M_storage + 0xf0) = *pp_Var7;
          }
          *(__buckets_ptr *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0xc0) = pp_Var45;
          uVar47 = (this->m_context).m_ipin_offsets._M_h._M_bucket_count;
          *(ulong *)((long)&(p_Var32->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                            ._M_storage._M_storage + 200) = uVar47;
          p_Var36 = (this->m_context).m_ipin_offsets._M_h._M_before_begin._M_nxt;
          *(_Hash_node_base **)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0xd0) = p_Var36;
          *(size_type *)
           ((long)&(p_Var32->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                   ._M_storage._M_storage + 0xd8) =
               (this->m_context).m_ipin_offsets._M_h._M_element_count;
          if (p_Var36 != (_Hash_node_base *)0x0) {
            pp_Var45[(ulong)p_Var36[6]._M_nxt % uVar47] =
                 (__node_base_ptr)
                 ((long)&(p_Var32->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                         ._M_storage._M_storage + 0xd0);
          }
          *(undefined1 (*) [16])
           &(this->m_context).m_ipin_offsets._M_h._M_rehash_policy._M_next_resize =
               (undefined1  [16])0x0;
          (this->m_context).m_ipin_offsets._M_h._M_bucket_count = 1;
          (this->m_context).m_ipin_offsets._M_h._M_buckets = pp_Var7;
          *(undefined1 (*) [16])local_2b0 = (undefined1  [16])0x0;
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::_M_move_assign((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)((long)&(p_Var32->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                                    ._M_storage._M_storage + 0xf8),__range1);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&(p_Var32->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                               ._M_storage._M_storage + 0x110),&this_02->_M_h);
        std::__cxx11::string::~string((string *)&main_node);
      }
      pugi::xml_named_node_iterator::operator++(&__begin1);
    }
    main_node = pugi::xml_node::child(&project_node,"main");
    bVar19 = pugi::xml_node::operator!(&main_node);
    if (!bVar19) {
      new_node.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pugi::xml_node::attribute(&main_node,"name");
      pugi::xml_attribute::value((xml_attribute *)&new_node);
      std::__cxx11::string::assign((char *)&(this->m_lsim_context->m_user_library).m_main_circuit);
    }
    bVar19 = !bVar19;
  }
  return bVar19;
LAB_0015cc6b:
  (_Var42._M_nxt)->_M_nxt = p_Var59->_M_nxt;
  p_Var59->_M_nxt = _Var42._M_nxt;
  __s_00[uVar47] = p_Var59;
  if ((_Var42._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var38 = __s_00 + uVar48;
LAB_0015cc8a:
    *pp_Var38 = _Var42._M_nxt;
  }
  goto LAB_0015cc3a;
LAB_0015cf1f:
  (_Var43._M_nxt)->_M_nxt = p_Var3->_M_nxt;
  p_Var3->_M_nxt = _Var43._M_nxt;
  __s_01[uVar47] = p_Var3;
  if ((_Var43._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var41 = __s_01 + uVar48;
LAB_0015cf36:
    *pp_Var41 = _Var43._M_nxt;
  }
  goto LAB_0015ceed;
}

Assistant:

bool LogisimParser::parse_xml() {

    auto project_node = m_xml_doc->child("project");
    if (!project_node) {
        return false;
    }

    /* iterate all circuits */
    for (auto circuit_node : project_node.children("circuit")) {
        parse_circuit(circuit_node);
    }

    /* get main circuit */
    auto main_node = project_node.child("main");
    if (!main_node) {
        return false;
    }

    auto main_circuit = main_node.attribute("name").value();
    m_lsim_context->user_library()->change_main_circuit(main_circuit);
    return true;
}